

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O2

void do_whois(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  long lVar2;
  BUFFER *buffer_00;
  bool bVar3;
  bool bVar4;
  short sVar5;
  int iVar6;
  CClass *pCVar7;
  char *pcVar8;
  char_data *victim;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  DESCRIPTOR_DATA **ppDVar9;
  uint uVar10;
  char *pcVar11;
  char *pcVar12;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  char *class_name;
  char **local_37c0;
  short *local_37b8;
  char *local_37b0;
  BUFFER *local_37a8;
  long local_37a0;
  char *local_3798;
  char *local_3790;
  char *local_3788;
  char *local_3780;
  char *local_3778;
  char *local_3770;
  char *local_3768;
  char *local_3760;
  char *local_3758;
  char *local_3750;
  string buffer;
  string local_3728;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3708;
  char *local_36e8;
  char *local_36d8;
  char *local_36c8;
  char *local_36b8;
  char *local_36a8;
  char *local_3698;
  char *local_3688;
  char *local_3678;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  local_3668;
  char **local_3658;
  char *local_3648;
  char disp [4608];
  char rbuf [4608];
  char arg [4608];
  
  one_argument(argument,arg);
  if (arg[0] == '\0') {
    send_to_char("Whois who?\n\r",ch);
  }
  else {
    buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
    buffer._M_string_length = 0;
    buffer.field_2._M_local_buf[0] = '\0';
    local_37a8 = new_buf();
    ppDVar9 = &descriptor_list;
    bVar4 = false;
LAB_002ab4c5:
    buffer_00 = local_37a8;
    pcVar8 = "";
    ppDVar9 = &((DESCRIPTOR_DATA *)ppDVar9)->next->next;
    if ((DESCRIPTOR_DATA *)ppDVar9 != (DESCRIPTOR_DATA *)0x0) {
      if ((((DESCRIPTOR_DATA *)ppDVar9)->connected == 0) &&
         (bVar3 = can_see(ch,((DESCRIPTOR_DATA *)ppDVar9)->character), bVar3)) {
        victim = ((DESCRIPTOR_DATA *)ppDVar9)->original;
        if (victim == (char_data *)0x0) {
          victim = ((DESCRIPTOR_DATA *)ppDVar9)->character;
        }
        bVar3 = can_see(ch,victim);
        if ((bVar3) &&
           (bVar3 = is_affected(((DESCRIPTOR_DATA *)ppDVar9)->character,(int)gsn_disguise), !bVar3))
        {
          bVar3 = str_cmp(victim->name,victim->true_name);
          local_37c0 = &victim->true_name;
          if (bVar3) {
            bVar3 = is_immortal(ch);
            if (!bVar3) goto LAB_002ab4c5;
            bVar3 = str_prefix(arg,*local_37c0);
          }
          else {
            bVar3 = str_prefix(arg,victim->name);
          }
          if (bVar3 == false) {
            pCVar7 = char_data::Class(victim);
            class_name = RString::operator_cast_to_char_(&pCVar7->who_name);
            pcVar11 = pcVar8;
            switch(victim->level) {
            case 0x34:
              class_name = "AVA";
              pcVar11 = "Avatar ";
              break;
            case 0x35:
              class_name = "ANG";
              goto LAB_002ab600;
            case 0x36:
              class_name = "DEM";
LAB_002ab600:
              pcVar11 = " Minor ";
              break;
            case 0x37:
              class_name = "IMM";
              goto LAB_002ab614;
            case 0x38:
              class_name = "GOD";
              goto LAB_002ab614;
            case 0x39:
              class_name = "DEI";
LAB_002ab614:
              pcVar11 = "Greater";
              break;
            case 0x3a:
              class_name = "SUP";
              goto LAB_002ab628;
            case 0x3b:
              class_name = "CRE";
LAB_002ab628:
              pcVar11 = " Elder ";
              break;
            case 0x3c:
              class_name = "IMP";
              pcVar11 = "Creator";
            }
            bVar4 = is_immortal(ch);
            local_37b8 = &victim->level;
            if ((bVar4) || ((bVar4 = is_heroimm(victim), bVar4 && (*local_37b8 < 0x34)))) {
              iVar6 = get_trust(ch);
              if (iVar6 < 0x34) {
                rbuf._0_2_ = rbuf._0_2_ & 0xff00;
              }
              else {
                rbuf[2] = '\0';
                rbuf[0] = ' ';
                rbuf[1] = ' ';
              }
              sVar5 = victim->race;
              iVar6 = get_trust(ch);
              if ((iVar6 < 0x34) ||
                 (local_3728._M_dataplus._M_p = " *", victim->pcdata->history_buffer == (char *)0x0)
                 ) {
                local_3728._M_dataplus._M_p = rbuf;
              }
              local_37b0 = (char *)(long)sVar5;
              bVar4 = can_pk(ch,victim);
              local_3750 = pcVar8;
              if (bVar4) {
                local_3750 = "(PK) ";
              }
              local_3758 = pcVar8;
              if (0x32 < victim->incog_level) {
                local_3758 = "(Incog) ";
              }
              local_3760 = pcVar8;
              if (0x32 < victim->invis_level) {
                local_3760 = "(Wizi) ";
              }
              sVar5 = victim->cabal;
              iVar6 = get_trust(ch);
              local_3768 = pcVar8;
              if ((0x38 < iVar6) && (local_3768 = "(MORON) ", (victim->act[0] & 0x200000) == 0)) {
                local_3768 = "";
              }
              local_3770 = pcVar8;
              if (((victim->comm[0] & 0x2000000) != 0) && (local_3770 = "", 0x33 < ch->level)) {
                local_3770 = "[AFK] ";
              }
              uVar10 = (uint)victim->act[0];
              local_3778 = "(WANTED) ";
              if ((uVar10 >> 0x1b & 1) == 0) {
                local_3778 = pcVar8;
              }
              local_3780 = "(THIEF) ";
              if ((uVar10 >> 0x19 & 1) == 0) {
                local_3780 = pcVar8;
              }
              local_3788 = "";
              bVar4 = is_npc(victim);
              local_3790 = pcVar8;
              if (!bVar4) {
                local_3790 = victim->pcdata->title;
              }
              bVar4 = is_npc(victim);
              if ((!bVar4) && (pcVar8 = victim->pcdata->extitle, pcVar8 == (char *)0x0)) {
                pcVar8 = "";
              }
              in_R9.values_ =
                   (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)&local_3728;
              local_3798 = pcVar8;
              ::fmt::v9::
              sprintf<char[43],short,char*,char_const*,char_const*,char_const*,char_const*,char_const*,char*,char_const*,char_const*,char_const*,char_const*,char_const*,char*,char_const*,char_const*,char>
                        (&local_3708,(v9 *)"[%2d %-5s %s%s] %s%s%s%s%s%s%s%s%s%s%s%s\n\r",
                         (char (*) [43])local_37b8,
                         (short *)&pc_race_table[(long)local_37b0].who_name_five,&class_name,
                         (char **)in_R9.values_,&local_3750,&local_3758,&local_3760,
                         &cabal_table[sVar5].who_name,&local_3768,&local_3770,&local_3778,
                         &local_3780,&local_3788,local_37c0,&local_3790,&local_3798,
                         (char **)class_name);
              std::__cxx11::string::operator=((string *)&buffer,(string *)&local_3708);
              std::__cxx11::string::~string((string *)&local_3708);
LAB_002ab92d:
              add_buf(local_37a8,buffer._M_dataplus._M_p);
            }
            else {
              iVar6 = get_trust(victim);
              if ((iVar6 < 0x34) || (bVar4 = is_immortal(ch), bVar4)) {
                if (victim->pcdata->shifted < 0) {
                  bVar4 = is_immortal(victim);
                  if (bVar4) {
                    sprintf(disp,"*   %s  *",pcVar11);
                  }
                  else {
                    sprintf(disp,"[%2d %-5s %s]",(ulong)(uint)(int)victim->level,
                            pc_race_table[victim->race].who_name_five,class_name);
                  }
                  bVar4 = can_pk(ch,victim);
                  local_37b8 = (short *)CONCAT62(local_37b8._2_6_,victim->incog_level);
                  sVar5 = victim->cabal;
                  sVar1 = victim->invis_level;
                  if (sVar5 == ch->cabal) {
LAB_002aba0e:
                    pcVar8 = cabal_table[sVar5].who_name;
                  }
                  else {
                    bVar3 = is_immortal(victim);
                    if (bVar3) {
                      sVar5 = victim->cabal;
                      goto LAB_002aba0e;
                    }
                  }
                  lVar2 = victim->act[0];
                  local_37a0 = victim->comm[0];
                  local_37b0 = pcVar8;
                  bVar3 = is_npc(victim);
                  local_37c0 = (char **)0x3dff64;
                  if (!bVar3) {
                    local_37c0 = (char **)victim->pcdata->title;
                  }
                  bVar3 = is_npc(victim);
                  local_3648 = "";
                  if ((!bVar3) && (local_3648 = victim->pcdata->extitle, local_3648 == (char *)0x0))
                  {
                    local_3648 = "";
                  }
                  local_3708.field_2._M_allocated_capacity = (size_type)"";
                  if (bVar4) {
                    local_3708.field_2._M_allocated_capacity = (size_type)"(PK) ";
                  }
                  local_36e8 = "";
                  if (0x32 < (short)local_37b8) {
                    local_36e8 = "(Incog) ";
                  }
                  local_36d8 = "";
                  if (0x32 < sVar1) {
                    local_36d8 = "(Wizi) ";
                  }
                  local_36a8 = "[AFK] ";
                  if (((uint)local_37a0 >> 0x19 & 1) == 0) {
                    local_36a8 = "";
                  }
                  uVar10 = (uint)lVar2;
                  local_3698 = "(WANTED) ";
                  if ((uVar10 >> 0x1b & 1) == 0) {
                    local_3698 = "";
                  }
                  in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
                           )victim->name;
                  local_3708._M_dataplus._M_p = disp;
                  local_36c8 = local_37b0;
                  local_36b8 = "";
                  local_3688 = "(THIEF) ";
                  if ((uVar10 >> 0x19 & 1) == 0) {
                    local_3688 = "";
                  }
                  local_3678 = "";
                  local_3658 = local_37c0;
                  fmt.size_ = 0xccccccccccccc;
                  fmt.data_ = (char *)0x1b;
                  args.field_1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
                                  )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
                                    )in_R9.values_;
                  args.desc_ = (unsigned_long_long)&local_3708;
                  local_3668 = in_R9;
                  ::fmt::v9::vformat_abi_cxx11_
                            (&local_3728,(v9 *)"{} {}{}{}{}{}{}{}{}{}{}{}\n\r",fmt,args);
                  std::__cxx11::string::operator=((string *)&buffer,(string *)&local_3728);
                  std::__cxx11::string::~string((string *)&local_3728);
                  goto LAB_002ab92d;
                }
              }
              else if (victim->pcdata->shifted < 0) {
                bVar4 = is_immortal(victim);
                if (bVar4) {
                  sprintf(disp,"*   %s  *",pcVar11);
                }
                else {
                  sprintf(disp,"[%2d %-5s %s]",(ulong)(uint)(int)victim->level,
                          pc_race_table[victim->race].who_name_five,class_name);
                }
                pcVar11 = pcVar8;
                if (victim->cabal == ch->cabal) {
                  pcVar11 = cabal_table[victim->cabal].who_name;
                }
                bVar4 = is_npc(victim);
                pcVar12 = pcVar8;
                if (!bVar4) {
                  pcVar12 = victim->pcdata->title;
                }
                bVar4 = is_npc(victim);
                if ((!bVar4) && (pcVar8 = victim->pcdata->extitle, pcVar8 == (char *)0x0)) {
                  pcVar8 = "";
                }
                local_36e8 = victim->name;
                local_3708._M_dataplus._M_p = disp;
                fmt_00.size_ = 0xccccc;
                fmt_00.data_ = (char *)0xd;
                args_00.field_1.args_ = in_R9.args_;
                args_00.desc_ = (unsigned_long_long)&local_3708;
                local_3708.field_2._M_allocated_capacity = (size_type)pcVar11;
                local_36d8 = pcVar12;
                local_36c8 = pcVar8;
                ::fmt::v9::vformat_abi_cxx11_(&local_3728,(v9 *)"{} {}{}{}{}\n\r",fmt_00,args_00);
                std::__cxx11::string::operator=((string *)&buffer,(string *)&local_3728);
                std::__cxx11::string::~string((string *)&local_3728);
                goto LAB_002ab92d;
              }
            }
            bVar4 = true;
          }
        }
      }
      goto LAB_002ab4c5;
    }
    if (bVar4) {
      pcVar8 = buf_string(local_37a8);
      page_to_char(pcVar8,ch);
      free_buf(buffer_00);
    }
    else {
      send_to_char("No one of that name is playing.\n\r",ch);
    }
    std::__cxx11::string::~string((string *)&buffer);
  }
  return;
}

Assistant:

void do_whois(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Whois who?\n\r", ch);
		return;
	}

	std::string buffer;

	auto output = new_buf();
	auto found = false;
	for (auto d = descriptor_list; d != nullptr; d = d->next)
	{
		char const *class_name;
		char const *imm_lvl;

		if (d->connected != CON_PLAYING || !can_see(ch, d->character))
			continue;

		auto wch = (d->original != nullptr) ? d->original : d->character;

		if (!can_see(ch, wch))
			continue;

		if (is_affected(d->character, gsn_disguise))
			continue;

		if (str_cmp(wch->name, wch->true_name)
			? is_immortal(ch)
				? !str_prefix(arg, wch->true_name) : 0
			: !str_prefix(arg, wch->name))
		{
			found = true;

			/* work out the printing */
			class_name = wch->Class()->who_name;
			switch (wch->level)
			{
				case MAX_LEVEL - 0:
					class_name = "IMP";
					imm_lvl = "Creator";
					break;
				case MAX_LEVEL - 1:
					class_name = "CRE";
					imm_lvl = " Elder ";
					break;
				case MAX_LEVEL - 2:
					class_name = "SUP";
					imm_lvl = " Elder ";
					break;
				case MAX_LEVEL - 3:
					class_name = "DEI";
					imm_lvl = "Greater";
					break;
				case MAX_LEVEL - 4:
					class_name = "GOD";
					imm_lvl = "Greater";
					break;
				case MAX_LEVEL - 5:
					class_name = "IMM";
					imm_lvl = "Greater";
					break;
				case MAX_LEVEL - 6:
					class_name = "DEM";
					imm_lvl = " Minor ";
					break;
				case MAX_LEVEL - 7:
					class_name = "ANG";
					imm_lvl = " Minor ";
					break;
				case MAX_LEVEL - 8:
					class_name = "AVA";
					imm_lvl = "Avatar ";
					break;
				default:
					imm_lvl = "";
					break;
			}

			char rbuf[MAX_STRING_LENGTH], disp[MAX_STRING_LENGTH];

			/* a little formatting */
			if (is_immortal(ch) || (is_heroimm(wch) && wch->level < 52))
			{
				if (get_trust(ch) >= 52)
					strcpy(rbuf, "  ");
				else
					strcpy(rbuf, "");

				buffer = fmt::sprintf("[%2d %-5s %s%s] %s%s%s%s%s%s%s%s%s%s%s%s\n\r",
					wch->level,
					pc_race_table[wch->race].who_name_five,
					class_name,
					get_trust(ch) >= 52 && wch->pcdata->history_buffer != nullptr ? " *" : rbuf,
					can_pk(ch, wch) ? "(PK) " : "",
					wch->incog_level >= LEVEL_HERO ? "(Incog) " : "",
					wch->invis_level >= LEVEL_HERO ? "(Wizi) " : "",
					cabal_table[wch->cabal].who_name,
					get_trust(ch) >= 57 && IS_SET(wch->act, PLR_MORON) ? "(MORON) " : "",
					IS_SET(wch->comm, COMM_AFK) && ch->level > 51 ? "[AFK] " : "",
					IS_SET(wch->act, PLR_CRIMINAL) ? "(WANTED) " : "",
					IS_SET(wch->act, PLR_THIEF) ? "(THIEF) " : "",
					isNewbie(wch) ? "(NEWBIE) " : "",
					wch->true_name,
					is_npc(wch) ? "" : wch->pcdata->title,
					is_npc(wch) ? "" : wch->pcdata->extitle ? wch->pcdata->extitle : "");
				add_buf(output, buffer.data());
			}
			else if (get_trust(wch) >= 52 && !is_immortal(ch))
			{
				if (wch->pcdata->shifted > -1)
					continue;

				if (is_immortal(wch))
					sprintf(disp, "*   %s  *", imm_lvl);
				else
					sprintf(disp, "[%2d %-5s %s]",
						wch->level,
						pc_race_table[wch->race].who_name_five,
						class_name);

				buffer = fmt::format("{} {}{}{}{}\n\r",
					disp,
					wch->cabal == ch->cabal ? cabal_table[wch->cabal].who_name : "",
					wch->name, 
					is_npc(wch) ? "" : wch->pcdata->title,
					is_npc(wch) ? "" : (wch->pcdata->extitle) ? wch->pcdata->extitle : ""); //TODO: change the rest of the sprintf calls to format

				add_buf(output, buffer.data());
			}
			else
			{
				if (wch->pcdata->shifted > -1)
					continue;

				if (is_immortal(wch))
					sprintf(disp, "*   %s  *", imm_lvl);
				else
					sprintf(disp, "[%2d %-5s %s]",
						wch->level,
						pc_race_table[wch->race].who_name_five,
						class_name);

				// TODO: originally had 13 placeholders, but it only has 12 arguments. could be a bug.
				buffer = fmt::format("{} {}{}{}{}{}{}{}{}{}{}{}\n\r",
					disp,
					can_pk(ch, wch) ? "(PK) " : "",
					wch->incog_level >= LEVEL_HERO ? "(Incog) " : "",
					wch->invis_level >= LEVEL_HERO ? "(Wizi) " : "",
					wch->cabal == ch->cabal || is_immortal(wch) ? cabal_table[wch->cabal].who_name : "", "",
					IS_SET(wch->comm, COMM_AFK) ? "[AFK] " : "",
					IS_SET(wch->act, PLR_CRIMINAL) ? "(WANTED) " : "",
					IS_SET(wch->act, PLR_THIEF) ? "(THIEF) " : "",
					isNewbie(wch) ? "(NEWBIE) " : "",
					wch->name,
					is_npc(wch) ? "" : wch->pcdata->title,
					is_npc(wch) ? "" : (wch->pcdata->extitle) ? wch->pcdata->extitle : "");
				add_buf(output, buffer.data());
			}
		}
	}

	if (!found)
	{
		send_to_char("No one of that name is playing.\n\r", ch);
		return;
	}

	page_to_char(buf_string(output), ch);
	free_buf(output);
}